

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_StartStream(PaStream *stream)

{
  int iVar1;
  PaError PVar2;
  
  if (initializationCount_ == 0) {
    iVar1 = -10000;
  }
  else {
    iVar1 = -0x2704;
    if ((stream != (PaStream *)0x0) && (*stream == 0x18273645)) {
      iVar1 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
      if (iVar1 == 0) {
        iVar1 = -0x26fe;
      }
      else if (iVar1 == 1) {
        PVar2 = (**(code **)(*(long *)((long)stream + 0x10) + 8))(stream);
        return PVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

PaError Pa_StartStream( PaStream *stream )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_StartStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
        if( result == 0 )
        {
            result = paStreamIsNotStopped ;
        }
        else if( result == 1 )
        {
            result = PA_STREAM_INTERFACE(stream)->Start( stream );
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_StartStream", result );

    return result;
}